

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O0

int __thiscall InputBuffer::read_from_fd(InputBuffer *this,int fd)

{
  int iVar1;
  Mempool *pMVar2;
  Chunk *pCVar3;
  ssize_t sVar4;
  int *piVar5;
  EVP_PKEY_CTX *src;
  bool bVar6;
  int local_2c;
  int already_read;
  Chunk *new_buf;
  int need_read;
  int fd_local;
  InputBuffer *this_local;
  
  new_buf._4_4_ = fd;
  _need_read = this;
  iVar1 = ioctl(fd,0x541b,&new_buf);
  if (iVar1 == -1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] ioctl FIONREAD error\n","error","read_from_fd",0x30);
    }
    this_local._4_4_ = -1;
  }
  else {
    if ((this->super_BufferBase).data_buf == (Chunk *)0x0) {
      pMVar2 = Mempool::get_instance();
      pCVar3 = Mempool::alloc_chunk(pMVar2,(int)new_buf);
      (this->super_BufferBase).data_buf = pCVar3;
      if ((this->super_BufferBase).data_buf == (Chunk *)0x0) {
        if (1 < pr_level) {
          printf("[%-5s][%s:%d] no free buf for alloc\n","info","read_from_fd",0x37);
        }
        return -1;
      }
    }
    else {
      if (((this->super_BufferBase).data_buf)->head != 0) {
        __assert_fail("data_buf->head == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                      ,0x3c,"int InputBuffer::read_from_fd(int)");
      }
      if (((this->super_BufferBase).data_buf)->capacity -
          ((this->super_BufferBase).data_buf)->length < (int)new_buf) {
        pMVar2 = Mempool::get_instance();
        pCVar3 = Mempool::alloc_chunk
                           (pMVar2,(int)new_buf + ((this->super_BufferBase).data_buf)->length);
        if (pCVar3 == (Chunk *)0x0) {
          if (1 < pr_level) {
            printf("[%-5s][%s:%d] no free buf for alloc\n","info","read_from_fd",0x40);
          }
          return -1;
        }
        Chunk::copy(pCVar3,(EVP_PKEY_CTX *)(this->super_BufferBase).data_buf,src);
        pMVar2 = Mempool::get_instance();
        Mempool::retrieve(pMVar2,(this->super_BufferBase).data_buf);
        (this->super_BufferBase).data_buf = pCVar3;
      }
    }
    do {
      if ((int)new_buf == 0) {
        sVar4 = read(new_buf._4_4_,
                     ((this->super_BufferBase).data_buf)->data +
                     ((this->super_BufferBase).data_buf)->length,0x1000);
        local_2c = (int)sVar4;
      }
      else {
        sVar4 = read(new_buf._4_4_,
                     ((this->super_BufferBase).data_buf)->data +
                     ((this->super_BufferBase).data_buf)->length,(long)(int)new_buf);
        local_2c = (int)sVar4;
      }
      bVar6 = false;
      if (local_2c == -1) {
        piVar5 = __errno_location();
        bVar6 = *piVar5 == 4;
      }
    } while (bVar6);
    if (0 < local_2c) {
      if (((int)new_buf != 0) && (local_2c != (int)new_buf)) {
        __assert_fail("already_read == need_read",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                      ,0x53,"int InputBuffer::read_from_fd(int)");
      }
      pCVar3 = (this->super_BufferBase).data_buf;
      pCVar3->length = local_2c + pCVar3->length;
    }
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

int InputBuffer::read_from_fd(int fd)
{
    int need_read;
    // FIONREAD: get readable bytes num in kernel buffer
    if (ioctl(fd, FIONREAD, &need_read) == -1) {
        PR_ERROR("ioctl FIONREAD error\n");
        return -1;
    }
    
    if (data_buf == nullptr) {
        data_buf = Mempool::get_instance().alloc_chunk(need_read);
        if (data_buf == nullptr) {
            PR_INFO("no free buf for alloc\n");
            return -1;
        }
    }
    else {
        assert(data_buf->head == 0);
        if (data_buf->capacity - data_buf->length < (int)need_read) {   
            Chunk *new_buf = Mempool::get_instance().alloc_chunk(need_read + data_buf->length);
            if (new_buf == nullptr) {
                PR_INFO("no free buf for alloc\n");
                return -1;
            }
            new_buf->copy(data_buf);
            Mempool::get_instance().retrieve(data_buf);
            data_buf = new_buf;
        }
    }

    int already_read = 0;
    do { 
        if(need_read == 0) {
            already_read = read(fd, data_buf->data + data_buf->length, m4K);
        } else {
            already_read = read(fd, data_buf->data + data_buf->length, need_read);
        }
    } while (already_read == -1 && errno == EINTR);
    if (already_read > 0)  {
        if (need_read != 0) {
            assert(already_read == need_read);
        }
        data_buf->length += already_read;
    }

    return already_read;
}